

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# decimal_cast_operators.hpp
# Opt level: O3

bool duckdb::TryDecimalStringCast<duckdb::hugeint_t,(char)46>
               (char *string_ptr,idx_t string_size,hugeint_t *result,uint8_t width,uint8_t scale)

{
  byte bVar1;
  char *pcVar2;
  bool bVar3;
  byte bVar4;
  uint uVar5;
  undefined7 in_register_00000009;
  char *pcVar6;
  ulong uVar7;
  char *pcVar8;
  char *pcVar9;
  ulong uVar10;
  ulong uVar11;
  char *pcVar12;
  ulong uVar13;
  ulong uVar14;
  idx_t iVar15;
  IntegerCastData<short> local_7a;
  char *local_78;
  char *local_70;
  ulong local_68;
  DecimalCastData<duckdb::hugeint_t> local_60;
  hugeint_t *local_38;
  
  local_38 = result;
  hugeint_t::hugeint_t(&local_60.result,0);
  uVar14 = (ulong)(uint)((int)CONCAT71(in_register_00000009,width) << 4);
  local_60.digit_count = '\0';
  local_60.decimal_count = '\0';
  local_60.round_set = false;
  local_60.should_round = false;
  local_60.excessive_decimals = '\0';
  local_60.exponent_type = NONE;
  local_60.limit.lower = *(uint64_t *)(Hugeint::POWERS_OF_TEN + uVar14);
  local_60.limit.upper = *(int64_t *)(Hugeint::POWERS_OF_TEN + uVar14 + 8);
  if (string_size == 0) {
    return false;
  }
  uVar14 = 0;
  while ((bVar4 = string_ptr[uVar14], bVar4 - 9 < 5 || (bVar4 == 0x20))) {
    uVar14 = uVar14 + 1;
    if (string_size == uVar14) {
      return false;
    }
  }
  local_60.width = width;
  local_60.scale = scale;
  if (bVar4 == 0x2d) {
    if (string_size - 1 == uVar14) {
      DecimalCastOperation::Finalize<duckdb::DecimalCastData<duckdb::hugeint_t>,true>(&local_60);
      return false;
    }
    pcVar9 = (char *)(string_size - uVar14);
    pcVar6 = &DAT_00000001;
    do {
      bVar4 = (pcVar6 + (long)string_ptr)[uVar14];
      if (9 < (byte)(bVar4 - 0x30)) {
        pcVar12 = pcVar6;
        if (bVar4 != 0x2e) goto LAB_0166bc08;
        pcVar12 = pcVar6 + 1;
        local_70 = pcVar12;
        pcVar2 = local_78;
        goto joined_r0x0166babd;
      }
      bVar3 = DecimalCastOperation::HandleDigit<duckdb::DecimalCastData<duckdb::hugeint_t>,true>
                        (&local_60,bVar4 - 0x30);
      if (!bVar3) {
        return false;
      }
      pcVar8 = pcVar9;
      if (~(ulong)pcVar6 + string_size == uVar14) break;
      if ((pcVar6 + (long)string_ptr)[uVar14 + 1] == '_') {
        if ((string_size - (long)pcVar6) - 2 == uVar14) {
          return false;
        }
        pcVar6 = pcVar6 + 2;
        if (9 < (byte)((string_ptr + (long)pcVar6)[uVar14] - 0x30U)) {
          return false;
        }
      }
      else {
        pcVar6 = pcVar6 + 1;
      }
      pcVar8 = pcVar6;
    } while (pcVar6 < pcVar9);
LAB_0166bc4f:
    bVar3 = DecimalCastOperation::Finalize<duckdb::DecimalCastData<duckdb::hugeint_t>,true>
                      (&local_60);
    if (!bVar3) {
      return false;
    }
    if (pcVar8 < (char *)0x2) {
      return false;
    }
    goto LAB_0166bd7b;
  }
  if (bVar4 == 0x30 && string_size - 1 != uVar14) {
    bVar1 = string_ptr[uVar14 + 1];
    if (bVar1 < 0x62) {
      if ((bVar1 != 0x42) && (bVar1 != 0x58)) goto LAB_0166ba00;
    }
    else if ((bVar1 != 0x62) && (bVar1 != 0x78)) goto LAB_0166ba00;
    if ((string_size - uVar14) - 3 < 0xfffffffffffffffe) {
      return false;
    }
  }
  else {
LAB_0166ba00:
    uVar7 = string_size - uVar14;
    uVar10 = (ulong)(bVar4 == 0x2b);
    local_78 = (char *)uVar10;
    if (uVar10 < uVar7) {
      do {
        bVar4 = string_ptr[uVar14 + uVar10];
        if (9 < (byte)(bVar4 - 0x30)) {
          uVar13 = uVar10;
          if (bVar4 != 0x2e) goto LAB_0166bd14;
          uVar13 = uVar10 + 1;
          local_68 = uVar13;
          pcVar6 = local_70;
          goto joined_r0x0166bb5f;
        }
        bVar3 = DecimalCastOperation::HandleDigit<duckdb::DecimalCastData<duckdb::hugeint_t>,false>
                          (&local_60,bVar4 - 0x30);
        if (!bVar3) {
          return false;
        }
        uVar11 = uVar7;
        if (~uVar10 + string_size == uVar14) break;
        if (string_ptr[uVar14 + 1 + uVar10] == '_') {
          if ((string_size - uVar10) - 2 == uVar14) {
            return false;
          }
          uVar10 = uVar10 + 2;
          if (9 < (byte)(string_ptr[uVar14 + uVar10] - 0x30U)) {
            return false;
          }
        }
        else {
          uVar10 = uVar10 + 1;
        }
        uVar11 = uVar10;
      } while (uVar10 < uVar7);
LAB_0166bd5b:
      bVar3 = DecimalCastOperation::Finalize<duckdb::DecimalCastData<duckdb::hugeint_t>,false>
                        (&local_60);
      if (!bVar3) {
        return false;
      }
      if (uVar11 <= local_78) {
        return false;
      }
LAB_0166bd7b:
      local_38->lower = local_60.result.lower;
      local_38->upper = local_60.result.upper;
      return true;
    }
  }
  DecimalCastOperation::Finalize<duckdb::DecimalCastData<duckdb::hugeint_t>,false>(&local_60);
  return false;
joined_r0x0166babd:
  pcVar8 = pcVar12;
  local_78 = pcVar2;
  if (pcVar9 <= pcVar12) {
LAB_0166bcd8:
    if ((pcVar6 <= &DAT_00000001) && (pcVar8 <= local_70)) {
      return false;
    }
    goto LAB_0166bc4f;
  }
  local_78 = string_ptr + (long)pcVar12;
  bVar4 = local_78[uVar14];
  if (9 < (byte)(bVar4 - 0x30)) {
    local_78 = pcVar2;
    if (pcVar12 <= local_70 && pcVar6 <= &DAT_00000001) {
      return false;
    }
LAB_0166bc08:
    uVar5 = (uint)bVar4;
    if (bVar4 < 0x20) {
      if (4 < uVar5 - 9) {
        return false;
      }
LAB_0166bc1f:
      pcVar12 = pcVar12 + 1;
      pcVar8 = pcVar12;
      if (pcVar12 < pcVar9) {
        do {
          if ((4 < (byte)(string_ptr + (long)pcVar12)[uVar14] - 9) &&
             ((string_ptr + (long)pcVar12)[uVar14] != 0x20)) {
            return false;
          }
          pcVar12 = pcVar12 + 1;
          pcVar8 = pcVar9;
        } while (pcVar9 != pcVar12);
      }
      goto LAB_0166bc4f;
    }
    if ((bVar4 != 0x65) && (uVar5 != 0x45)) {
      if (uVar5 != 0x20) {
        return false;
      }
      goto LAB_0166bc1f;
    }
    if (pcVar12 == &DAT_00000001) {
      return false;
    }
    if (pcVar9 <= pcVar12 + 1) {
      return false;
    }
    local_7a.result = 0;
    pcVar6 = string_ptr + (long)pcVar12 + uVar14 + 1;
    iVar15 = ~uVar14 + (string_size - (long)pcVar12);
    if (*pcVar6 == '-') {
      bVar3 = IntegerCastLoop<duckdb::IntegerCastData<short>,true,false,duckdb::IntegerCastOperation,(char)46>
                        (pcVar6,iVar15,&local_7a,false);
    }
    else {
      bVar3 = IntegerCastLoop<duckdb::IntegerCastData<short>,false,false,duckdb::IntegerCastOperation,(char)46>
                        (pcVar6,iVar15,&local_7a,false);
    }
    if (bVar3 == false) {
      return false;
    }
    bVar3 = DecimalCastOperation::HandleExponent<duckdb::DecimalCastData<duckdb::hugeint_t>,true>
                      (&local_60,(int)local_7a.result);
    goto LAB_0166be5f;
  }
  bVar3 = DecimalCastOperation::HandleDecimal<duckdb::DecimalCastData<duckdb::hugeint_t>,true,true>
                    (&local_60,bVar4 - 0x30);
  if (!bVar3) {
    return false;
  }
  pcVar8 = pcVar9;
  if (~(ulong)pcVar12 + string_size == uVar14) goto LAB_0166bcd8;
  pcVar2 = local_78;
  if (local_78[uVar14 + 1] == '_') {
    if ((string_size - (long)pcVar12) - 2 == uVar14) {
      return false;
    }
    pcVar12 = pcVar12 + 2;
    if (9 < (byte)((string_ptr + (long)pcVar12)[uVar14] - 0x30U)) {
      return false;
    }
  }
  else {
    pcVar12 = pcVar12 + 1;
  }
  goto joined_r0x0166babd;
joined_r0x0166bb5f:
  uVar11 = uVar13;
  local_70 = pcVar6;
  if (uVar7 <= uVar13) {
LAB_0166bdef:
    if ((uVar10 <= local_78) && (uVar11 <= local_68)) {
      return false;
    }
    goto LAB_0166bd5b;
  }
  local_70 = string_ptr + uVar13;
  bVar4 = local_70[uVar14];
  if (9 < (byte)(bVar4 - 0x30)) {
    local_70 = pcVar6;
    if (uVar13 <= local_68 && uVar10 <= local_78) {
      return false;
    }
LAB_0166bd14:
    uVar5 = (uint)bVar4;
    if (bVar4 < 0x20) {
      if (4 < uVar5 - 9) {
        return false;
      }
    }
    else {
      if ((bVar4 == 0x65) || (uVar5 == 0x45)) {
        if ((char *)uVar13 == local_78) {
          return false;
        }
        if (uVar7 <= uVar13 + 1) {
          return false;
        }
        local_7a.result = 0;
        pcVar6 = string_ptr + uVar14 + uVar13 + 1;
        iVar15 = ~uVar14 + (string_size - uVar13);
        if (*pcVar6 == '-') {
          bVar3 = IntegerCastLoop<duckdb::IntegerCastData<short>,true,false,duckdb::IntegerCastOperation,(char)46>
                            (pcVar6,iVar15,&local_7a,false);
        }
        else {
          bVar3 = IntegerCastLoop<duckdb::IntegerCastData<short>,false,false,duckdb::IntegerCastOperation,(char)46>
                            (pcVar6,iVar15,&local_7a,false);
        }
        if (bVar3 == false) {
          return false;
        }
        bVar3 = DecimalCastOperation::
                HandleExponent<duckdb::DecimalCastData<duckdb::hugeint_t>,false>
                          (&local_60,(int)local_7a.result);
LAB_0166be5f:
        if (bVar3 == false) {
          return false;
        }
        goto LAB_0166bd7b;
      }
      if (uVar5 != 0x20) {
        return false;
      }
    }
    uVar13 = uVar13 + 1;
    uVar11 = uVar13;
    if (uVar13 < uVar7) {
      do {
        if ((4 < (byte)string_ptr[uVar14 + uVar13] - 9) && (string_ptr[uVar14 + uVar13] != 0x20)) {
          return false;
        }
        uVar13 = uVar13 + 1;
        uVar11 = uVar7;
      } while (uVar7 != uVar13);
    }
    goto LAB_0166bd5b;
  }
  bVar3 = DecimalCastOperation::HandleDecimal<duckdb::DecimalCastData<duckdb::hugeint_t>,false,true>
                    (&local_60,bVar4 - 0x30);
  if (!bVar3) {
    return false;
  }
  uVar11 = uVar7;
  if (~uVar13 + string_size == uVar14) goto LAB_0166bdef;
  pcVar6 = local_70;
  if (local_70[uVar14 + 1] == '_') {
    if ((string_size - uVar13) - 2 == uVar14) {
      return false;
    }
    uVar13 = uVar13 + 2;
    if (9 < (byte)(string_ptr[uVar14 + uVar13] - 0x30U)) {
      return false;
    }
  }
  else {
    uVar13 = uVar13 + 1;
  }
  goto joined_r0x0166bb5f;
}

Assistant:

bool TryDecimalStringCast(const char *string_ptr, idx_t string_size, T &result, uint8_t width, uint8_t scale) {
	DecimalCastData<T> state;
	state.result = 0;
	state.width = width;
	state.scale = scale;
	state.digit_count = 0;
	state.decimal_count = 0;
	state.excessive_decimals = 0;
	state.exponent_type = ExponentType::NONE;
	state.round_set = false;
	state.should_round = false;
	state.limit = UnsafeNumericCast<T>(DecimalCastTraits<T>::POWERS_OF_TEN_CLASS::POWERS_OF_TEN[width]);
	if (!TryIntegerCast<DecimalCastData<T>, true, true, DecimalCastOperation, false, decimal_separator>(
	        string_ptr, string_size, state, false)) {
		return false;
	}
	result = state.result;
	return true;
}